

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNBu12.h
# Opt level: O2

void __thiscall NaPNBus1i2o::~NaPNBus1i2o(NaPNBus1i2o *this)

{
  (this->super_NaPetriNode)._vptr_NaPetriNode = (_func_int **)&PTR__NaPNBus1i2o_00174f28;
  NaPetriCnOutput::~NaPetriCnOutput(&this->out2);
  NaPetriCnOutput::~NaPetriCnOutput(&this->out1);
  NaPetriCnInput::~NaPetriCnInput(&this->in);
  NaPetriNode::~NaPetriNode(&this->super_NaPetriNode);
  return;
}

Assistant:

class PNNA_API NaPNBus1i2o : public NaPetriNode
{
public:

    // Create node for Petri network
    NaPNBus1i2o (const char* szNodeName = "bus1i2o");


    ////////////////
    // Connectors //
    ////////////////

    // Input (mainstream)
    NaPetriCnInput      in;

    // Output #1
    NaPetriCnOutput     out1;

    // Output #2
    NaPetriCnOutput     out2;


    ///////////////////
    // Node specific //
    ///////////////////

    /// Set output connector proportion: n1/n2
    /// If n1=n2 then out1=out2[+1]
    /// If n1=0 then out2 has dim=n2
    /// If n2=0 then out1 has dim=n1
    void	set_out_dim_proportion (int n1, int n2);

    ///////////////////
    // Quick linkage //
    ///////////////////

    // Return mainstream input connector (the only input or NULL)
    virtual NaPetriConnector*   main_input_cn ();

    
    ///////////////////////
    // Phases of network //
    ///////////////////////

    // 2. Link connectors inside the node
    virtual void        relate_connectors ();

    // 5. Verification to be sure all is OK (true)
    virtual bool        verify ();

    // 8. True action of the node (if activate returned true)
    virtual void        action ();

protected:

    /// Output dimension proportion
    int			nOutDimProp1, nOutDimProp2;

}